

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Plan::EdgeFinished(Plan *this,Edge *edge,EdgeResult result,string *err)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  _Base_ptr p_Var5;
  iterator __position;
  pointer ppNVar6;
  bool bVar7;
  
  p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(Edge **)(p_Var3 + 1) < edge]) {
    if (*(Edge **)(p_Var3 + 1) >= edge) {
      p_Var5 = p_Var3;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (__position._M_node = p_Var5, edge < *(Edge **)(p_Var5 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    iVar2 = *(int *)&__position._M_node[1]._M_parent;
    if (iVar2 != 0) {
      Pool::EdgeFinished(edge->pool_,edge);
    }
    Pool::RetrieveReadyEdges(edge->pool_,&this->ready_);
    bVar7 = true;
    if (result == kEdgeSucceeded) {
      if (iVar2 != 0) {
        this->wanted_edges_ = this->wanted_edges_ + -1;
      }
      std::
      _Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
      ::erase_abi_cxx11_((_Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                          *)this,__position);
      edge->outputs_ready_ = true;
      ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar7 = ppNVar6 ==
              (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if ((!bVar7) && (bVar4 = NodeFinished(this,*ppNVar6,err), bVar4)) {
        do {
          ppNVar6 = ppNVar6 + 1;
          bVar7 = ppNVar6 ==
                  (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
          if (bVar7) {
            return bVar7;
          }
          bVar4 = NodeFinished(this,*ppNVar6,err);
        } while (bVar4);
      }
    }
    return bVar7;
  }
  __assert_fail("e != want_.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                0xbe,"bool Plan::EdgeFinished(Edge *, EdgeResult, string *)");
}

Assistant:

bool Plan::EdgeFinished(Edge* edge, EdgeResult result, string* err) {
  map<Edge*, Want>::iterator e = want_.find(edge);
  assert(e != want_.end());
  bool directly_wanted = e->second != kWantNothing;

  // See if this job frees up any delayed jobs.
  if (directly_wanted)
    edge->pool()->EdgeFinished(*edge);
  edge->pool()->RetrieveReadyEdges(&ready_);

  // The rest of this function only applies to successful commands.
  if (result != kEdgeSucceeded)
    return true;

  if (directly_wanted)
    --wanted_edges_;
  want_.erase(e);
  edge->outputs_ready_ = true;

  // Check off any nodes we were waiting for with this edge.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!NodeFinished(*o, err))
      return false;
  }
  return true;
}